

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_MappingRef::Read(ON_MappingRef *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_MappingRef *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_1c = 0;
  local_20 = 0;
  local_21 = ON_BinaryArchive::BeginRead3dmChunk
                       (_minor_version,0x40008000,&stack0xffffffffffffffe4,&local_20);
  if (local_21) {
    local_21 = iStack_1c == 1;
    if (local_21) {
      local_21 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_plugin_id);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_mapping_channels);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_21 = false;
    }
  }
  return local_21;
}

Assistant:

bool ON_MappingRef::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if (rc)
  {
    rc = (1 == major_version);

    if (rc) rc = archive.ReadUuid( m_plugin_id );
    if (rc) rc = archive.ReadArray( m_mapping_channels );

    if ( !archive.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}